

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O1

asn_dec_rval_t
NativeInteger_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  INTEGER_t *pIVar1;
  int iVar2;
  unsigned_long *lptr;
  asn_dec_rval_code_e aVar4;
  asn_dec_rval_t aVar5;
  INTEGER_t tmpint;
  void *tmpintptr;
  INTEGER_t local_58;
  void *local_40;
  undefined1 *local_38;
  size_t sVar3;
  
  local_38 = (undefined1 *)&local_58;
  local_40 = td->specifics;
  lptr = (unsigned_long *)*sptr;
  pIVar1 = &local_58;
  if (lptr == (unsigned_long *)0x0) {
    lptr = (unsigned_long *)calloc(1,8);
    *sptr = lptr;
    pIVar1 = (INTEGER_t *)local_38;
    if (lptr == (unsigned_long *)0x0) {
      aVar4 = RC_FAIL;
      sVar3 = 0;
      goto LAB_001419bc;
    }
  }
  local_38 = (undefined1 *)pIVar1;
  local_58.buf = (uint8_t *)0x0;
  local_58.size = 0;
  local_58._12_4_ = 0;
  aVar5 = INTEGER_decode_uper(opt_codec_ctx,td,constraints,&local_38,pd);
  sVar3 = aVar5.consumed;
  aVar4 = aVar5.code;
  if (aVar4 == RC_OK) {
    if ((local_40 == (void *)0x0) || (*(int *)((long)local_40 + 0x20) == 0)) {
      iVar2 = asn_INTEGER2long(&local_58,(long *)lptr);
    }
    else {
      iVar2 = asn_INTEGER2ulong(&local_58,lptr);
    }
    aVar4 = RC_FAIL;
    if (iVar2 == 0) {
      aVar4 = RC_OK;
    }
  }
  (*asn_DEF_INTEGER.free_struct)(&asn_DEF_INTEGER,&local_58,1);
LAB_001419bc:
  aVar5._4_4_ = 0;
  aVar5.code = aVar4;
  aVar5.consumed = sVar3;
  return aVar5;
}

Assistant:

asn_dec_rval_t
NativeInteger_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {

	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval;
	long *native = (long *)*sptr;
	INTEGER_t tmpint;
	void *tmpintptr = &tmpint;

	(void)opt_codec_ctx;
	ASN_DEBUG("Decoding NativeInteger %s (UPER)", td->name);

	if(!native) {
		native = (long *)(*sptr = CALLOC(1, sizeof(*native)));
		if(!native) ASN__DECODE_FAILED;
	}

	memset(&tmpint, 0, sizeof tmpint);
	rval = INTEGER_decode_uper(opt_codec_ctx, td, constraints,
				   &tmpintptr, pd);
	if(rval.code == RC_OK) {
		if((specs&&specs->field_unsigned)
			? asn_INTEGER2ulong(&tmpint, (unsigned long *)native)
			: asn_INTEGER2long(&tmpint, native))
			rval.code = RC_FAIL;
		else
			ASN_DEBUG("NativeInteger %s got value %ld",
				td->name, *native);
	}
	ASN_STRUCT_FREE_CONTENTS_ONLY(asn_DEF_INTEGER, &tmpint);

	return rval;
}